

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# measunit.cpp
# Opt level: O2

int32_t icu_63::MeasureUnit::getAvailable
                  (char *type,MeasureUnit *dest,int32_t destCapacity,UErrorCode *errorCode)

{
  int32_t iVar1;
  ulong uVar2;
  ulong uVar3;
  uint uVar4;
  char *pcVar5;
  
  uVar4 = 0;
  if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    uVar4 = 0;
    iVar1 = binarySearch((char **)gTypes,0,0x14,type);
    if (iVar1 != -1) {
      uVar4 = (&DAT_002e7064)[iVar1] - (&gOffsets)[iVar1];
      if (destCapacity < (int)uVar4) {
        *errorCode = U_BUFFER_OVERFLOW_ERROR;
      }
      else {
        uVar2 = 0;
        uVar3 = 0;
        if (0 < (int)uVar4) {
          uVar3 = (ulong)uVar4;
        }
        pcVar5 = dest->fCurrency;
        for (; uVar3 != uVar2; uVar2 = uVar2 + 1) {
          *(int32_t *)(pcVar5 + -8) = iVar1;
          *(int32_t *)(pcVar5 + -4) = (int32_t)uVar2;
          *pcVar5 = '\0';
          pcVar5 = pcVar5 + 0x18;
        }
      }
    }
  }
  return uVar4;
}

Assistant:

int32_t MeasureUnit::getAvailable(
        const char *type,
        MeasureUnit *dest,
        int32_t destCapacity,
        UErrorCode &errorCode) {
    if (U_FAILURE(errorCode)) {
        return 0;
    }
    int32_t typeIdx = binarySearch(gTypes, 0, UPRV_LENGTHOF(gTypes), type);
    if (typeIdx == -1) {
        return 0;
    }
    int32_t len = gOffsets[typeIdx + 1] - gOffsets[typeIdx];
    if (destCapacity < len) {
        errorCode = U_BUFFER_OVERFLOW_ERROR;
        return len;
    }
    for (int subTypeIdx = 0; subTypeIdx < len; ++subTypeIdx) {
        dest[subTypeIdx].setTo(typeIdx, subTypeIdx);
    }
    return len;
}